

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcread.c
# Opt level: O3

uint32_t bcread_uleb128(LexState *ls)

{
  byte bVar1;
  uint uVar2;
  byte bVar3;
  MSize MVar4;
  byte *pbVar5;
  byte *pbVar6;
  
  bVar3 = *ls->p;
  uVar2 = (uint)bVar3;
  pbVar5 = (byte *)(ls->p + 1);
  if ((char)bVar3 < '\0') {
    uVar2 = bVar3 & 0x7f;
    MVar4 = ls->n;
    bVar3 = 7;
    pbVar6 = pbVar5;
    do {
      uVar2 = uVar2 | (*pbVar6 & 0x7f) << (bVar3 & 0x1f);
      MVar4 = MVar4 - 1;
      ls->n = MVar4;
      pbVar5 = pbVar6 + 1;
      bVar3 = bVar3 + 7;
      bVar1 = *pbVar6;
      pbVar6 = pbVar5;
    } while ((char)bVar1 < '\0');
  }
  else {
    MVar4 = ls->n;
  }
  ls->n = MVar4 - 1;
  ls->p = (char *)pbVar5;
  return uVar2;
}

Assistant:

static uint32_t bcread_uleb128(LexState *ls)
{
  const uint8_t *p = (const uint8_t *)ls->p;
  uint32_t v = *p++;
  if (LJ_UNLIKELY(v >= 0x80)) {
    int sh = 0;
    v &= 0x7f;
    do {
     v |= ((*p & 0x7f) << (sh += 7));
     bcread_dec(ls);
   } while (*p++ >= 0x80);
  }
  bcread_dec(ls);
  ls->p = (char *)p;
  return v;
}